

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void make_angry_shk(monst *shkp,xchar ox,xchar oy)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  eshk *eshkp;
  xchar sy;
  xchar sx;
  xchar oy_local;
  xchar ox_local;
  monst *shkp_local;
  
  if ((((*(short *)((long)&shkp[0x1b].misc_worn_check + 2) != 0) ||
       (*(int *)&shkp[0x1b].field_0x60 != 0)) ||
      (iVar3._0_1_ = shkp[0x1b].mfleetim, iVar3._1_1_ = shkp[0x1b].wormno,
      iVar3._2_1_ = shkp[0x1b].weapon_check, iVar3._3_1_ = shkp[0x1b].field_0x67, iVar3 != 0)) ||
     (shkp[0x1b].mappearance != 0)) {
    lVar5 = addupbill(shkp);
    *(int *)&shkp[0x1b].mtame =
         *(int *)&shkp[0x1b].mtame +
         (int)lVar5 + *(int *)&shkp[0x1b].field_0x60 + *(int *)&shkp[0x1b].mfleetim;
    *(uint *)&shkp[0x1b].mtame = *(int *)&shkp[0x1b].mtame - shkp[0x1b].mappearance;
    iVar4._0_1_ = shkp[0x1b].mtame;
    iVar4._1_1_ = shkp[0x1b].m_ap_type;
    iVar4._2_1_ = shkp[0x1b].mfrozen;
    iVar4._3_1_ = shkp[0x1b].mblinded;
    if (iVar4 < 0) {
      shkp[0x1b].mtame = '\0';
      shkp[0x1b].m_ap_type = '\0';
      shkp[0x1b].mfrozen = '\0';
      shkp[0x1b].mblinded = '\0';
    }
    setpaid(shkp);
  }
  cVar1 = shkp->mx;
  cVar2 = shkp->my;
  if ((('\0' < ox) && (ox < 'P')) &&
     ((-1 < oy && ((oy < '\x15' && ((viz_array[oy][ox] & 2U) != 0)))))) {
    if ((viz_array[cVar2][cVar1] & 2U) == 0) {
      shkp->mx = ox;
      shkp->my = oy;
    }
  }
  pcVar6 = Monnam(shkp);
  pcVar7 = "is furious";
  if ((*(uint *)&shkp->field_0x60 >> 0x16 & 1) != 0) {
    pcVar7 = "gets angry";
  }
  pline("%s %s!",pcVar6,pcVar7);
  shkp->mx = cVar1;
  shkp->my = cVar2;
  hot_pursuit(shkp);
  return;
}

Assistant:

void make_angry_shk(struct monst *shkp, xchar ox, xchar oy)
{
	xchar sx, sy;
	struct eshk *eshkp = ESHK(shkp);

	/* all pending shop transactions are now "past due" */
	if (eshkp->billct || eshkp->debit || eshkp->loan || eshkp->credit) {
	    eshkp->robbed += (addupbill(shkp) + eshkp->debit + eshkp->loan);
	    eshkp->robbed -= eshkp->credit;
	    if (eshkp->robbed < 0L) eshkp->robbed = 0L;
	    /* billct, debit, loan, and credit will be cleared by setpaid */
	    setpaid(shkp);
	}

	/* If you just used a wand of teleportation to send the shk away, you
	   might not be able to see her any more.  Monnam would yield "it",
	   which makes this message look pretty silly, so temporarily restore
	   her original location during the call to Monnam. */
	sx = shkp->mx,  sy = shkp->my;
	if (isok(ox, oy) && cansee(ox, oy) && !cansee(sx, sy))
		shkp->mx = ox,  shkp->my = oy;
	pline("%s %s!", Monnam(shkp),
	      !ANGRY(shkp) ? "gets angry" : "is furious");
	shkp->mx = sx,  shkp->my = sy;
	hot_pursuit(shkp);
}